

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O0

string * __thiscall
flow::MatchInstr::to_string_abi_cxx11_(string *__return_storage_ptr__,MatchInstr *this)

{
  MatchClass MVar1;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  MatchInstr *local_18;
  MatchInstr *this_local;
  
  local_18 = this;
  this_local = (MatchInstr *)__return_storage_ptr__;
  MVar1 = op(this);
  switch(MVar1) {
  case Same:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"match.same",&local_39);
    Instr::formatOne(__return_storage_ptr__,(Instr *)this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    break;
  case Head:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"match.head",&local_71);
    Instr::formatOne(__return_storage_ptr__,(Instr *)this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    break;
  case Tail:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"match.tail",&local_99);
    Instr::formatOne(__return_storage_ptr__,(Instr *)this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    break;
  case RegExp:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"match.re",&local_c1);
    Instr::formatOne(__return_storage_ptr__,(Instr *)this,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    break;
  default:
    abort();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MatchInstr::to_string() const {
  switch (op()) {
    case MatchClass::Same:
      return formatOne("match.same");
    case MatchClass::Head:
      return formatOne("match.head");
    case MatchClass::Tail:
      return formatOne("match.tail");
    case MatchClass::RegExp:
      return formatOne("match.re");
    default:
      abort();
  }
}